

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O0

void TestServerConnector::VerifyNotificationResult(string *raw_response)

{
  code *pcVar1;
  byte extraout_AL;
  double __x;
  bool local_f5;
  ExpressionDecomposer local_f4;
  Expression_lhs<bool> local_f0;
  Result local_e8;
  String local_b8;
  undefined1 local_a0 [8];
  ResultBuilder DOCTEST_RB;
  string *raw_response_local;
  
  DOCTEST_RB.super_AssertData.m_exception_string._24_8_ = raw_response;
  doctest::String::String(&local_b8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_a0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x28,"raw_response.empty()","",&local_b8);
  doctest::String::~String(&local_b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_f4,DT_REQUIRE);
  local_f5 = (bool)std::__cxx11::string::empty();
  local_f0 = doctest::detail::ExpressionDecomposer::operator<<(&local_f4,&local_f5);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_e8,(Expression_lhs *)&local_f0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_a0,&local_e8);
  doctest::detail::Result::~Result(&local_e8);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_a0,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_a0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_a0);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

static void VerifyNotificationResult(string &raw_response) { REQUIRE(raw_response.empty()); }